

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::APFloat::Storage::Storage(Storage *this,IEEEFloat *F,fltSemantics *Semantics)

{
  fltSemantics *Semantics_00;
  APFloat local_80;
  undefined1 local_60 [32];
  IEEEFloat local_40;
  
  if (Semantics != (fltSemantics *)semPPCDoubleDouble) {
    detail::IEEEFloat::IEEEFloat((IEEEFloat *)this,F);
    return;
  }
  Semantics_00 = F->semantics;
  detail::IEEEFloat::IEEEFloat(&local_40,F);
  detail::IEEEFloat::IEEEFloat((IEEEFloat *)&local_80,&local_40);
  Storage((Storage *)(local_60 + 8),(IEEEFloat *)&local_80,Semantics_00);
  detail::IEEEFloat::~IEEEFloat((IEEEFloat *)&local_80);
  detail::IEEEFloat::IEEEFloat(&local_80.U.IEEE,(fltSemantics *)semIEEEdouble);
  detail::DoubleAPFloat::DoubleAPFloat
            ((DoubleAPFloat *)this,(fltSemantics *)semPPCDoubleDouble,(APFloat *)local_60,&local_80)
  ;
  ~Storage((Storage *)&local_80.U.IEEE);
  ~Storage((Storage *)(local_60 + 8));
  detail::IEEEFloat::~IEEEFloat(&local_40);
  return;
}

Assistant:

APFloat::Storage::Storage(IEEEFloat F, const fltSemantics &Semantics) {
  if (usesLayout<IEEEFloat>(Semantics)) {
    new (&IEEE) IEEEFloat(std::move(F));
    return;
  }
  if (usesLayout<DoubleAPFloat>(Semantics)) {
    const auto& semantics = F.getSemantics();
    new (&Double)
        DoubleAPFloat(Semantics, APFloat(std::move(F), semantics),
                      APFloat(semIEEEdouble));
    return;
  }
  llvm_unreachable("Unexpected semantics");
}